

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

int get_decimals(int Decimals,int64_t IntValue)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  for (lVar2 = IntValue + 1; lVar2 < 0xccccccccccccccc; lVar2 = lVar2 * 10) {
    iVar1 = iVar1 + 1;
  }
  if (iVar1 < Decimals) {
    Decimals = iVar1;
  }
  return Decimals;
}

Assistant:

static int get_decimals(int Decimals, int64_t IntValue)
{
    int Result = 0;
    int64_t TmpVal = IntValue+1;
    while (TmpVal < INT64_MAX/10)
    {
        TmpVal *= 10;
        Result++;
    }
    return MIN(Decimals,Result);
}